

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filereader.cpp
# Opt level: O1

Filereader * Filereader::getFilereader(HighsLogOptions *log_options,string *filename)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  Filereader *pFVar4;
  undefined *puVar5;
  size_type sVar6;
  string lower_case_extension;
  string extension;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + filename->_M_string_length);
  getFilenameExt(&local_80,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_80);
  if (iVar3 == 0) {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)filename);
    getFilenameExt(&local_a0,&local_60);
    std::__cxx11::string::_M_assign((string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,local_80._M_dataplus._M_p,
             local_80._M_dataplus._M_p + local_80._M_string_length);
  _Var2._M_p = local_a0._M_dataplus._M_p;
  if (local_a0._M_string_length != 0) {
    sVar6 = 0;
    do {
      iVar3 = tolower((uint)(byte)_Var2._M_p[sVar6]);
      _Var2._M_p[sVar6] = (char)iVar3;
      sVar6 = sVar6 + 1;
    } while (local_a0._M_string_length != sVar6);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_a0);
  if (iVar3 == 0) {
    pFVar4 = (Filereader *)operator_new(8);
    puVar5 = &FilereaderMps::vtable;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_a0);
    if (iVar3 == 0) {
      pFVar4 = (Filereader *)operator_new(0x10);
      pFVar4->_vptr_Filereader = (_func_int **)0x0;
      pFVar4[1]._vptr_Filereader = (_func_int **)0x0;
      puVar5 = &FilereaderLp::vtable;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_a0);
      if (iVar3 != 0) {
        pFVar4 = (Filereader *)0x0;
        goto LAB_001eed79;
      }
      pFVar4 = (Filereader *)operator_new(8);
      puVar5 = &FilereaderEms::vtable;
    }
  }
  pFVar4->_vptr_Filereader = (_func_int **)(puVar5 + 0x10);
LAB_001eed79:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return pFVar4;
}

Assistant:

Filereader* Filereader::getFilereader(const HighsLogOptions& log_options,
                                      const std::string filename) {
  Filereader* reader;
  std::string extension = getFilenameExt(filename);
  if (extension == "gz") {
#ifdef ZLIB_FOUND
    extension = getFilenameExt(filename.substr(0, filename.size() - 3));
#else
    highsLogUser(log_options, HighsLogType::kError,
                 "HiGHS build without zlib support. Cannot read .gz file.\n",
                 filename.c_str());
    reader = NULL;
#endif
    //  } else if (extension == "zip") {
    // #ifdef ZLIB_FOUND
    //    extension = getFilenameExt(filename.substr(0, filename.size() - 4));
    // #else
    //    highsLogUser(log_options, HighsLogType::kError,
    //                 "HiGHS build without zlib support. Cannot read .zip
    //                 file.\n", filename.c_str());
    //    reader = NULL;
    // #endif
  }
  std::string lower_case_extension = extension;
  tolower(lower_case_extension);
  if (lower_case_extension.compare("mps") == 0) {
    reader = new FilereaderMps();
  } else if (lower_case_extension.compare("lp") == 0) {
    reader = new FilereaderLp();
  } else if (lower_case_extension.compare("ems") == 0) {
    reader = new FilereaderEms();
  } else {
    reader = NULL;
  }
  return reader;
}